

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsClippedEx(ImRect *bb,ImGuiID id,bool clip_even_when_logged)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool clip_even_when_logged_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  bVar2 = ImRect::Overlaps(bb,&GImGui->CurrentWindow->ClipRect);
  if (((bVar2) || ((id != 0 && ((id == pIVar1->ActiveId || (id == pIVar1->NavId)))))) ||
     ((!clip_even_when_logged && ((pIVar1->LogEnabled & 1U) != 0)))) {
    bb_local._7_1_ = false;
  }
  else {
    bb_local._7_1_ = true;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::IsClippedEx(const ImRect& bb, ImGuiID id, bool clip_even_when_logged)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!bb.Overlaps(window->ClipRect))
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (clip_even_when_logged || !g.LogEnabled)
                return true;
    return false;
}